

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

void quicly_send_datagram_frames(quicly_conn_t *conn,ptls_iovec_t *datagrams,size_t num_datagrams)

{
  size_t sVar1;
  size_t __size;
  void *__dest;
  size_t sVar2;
  long lVar3;
  
  if (num_datagrams != 0) {
    sVar1 = (conn->egress).datagram_frame_payloads.count;
    lVar3 = 0;
    sVar2 = sVar1;
    do {
      sVar2 = sVar2 + 1;
      if (sVar2 == 0xb) {
        return;
      }
      __size = *(size_t *)((long)&datagrams->len + lVar3);
      __dest = malloc(__size);
      if (__dest == (void *)0x0) {
        return;
      }
      memcpy(__dest,*(void **)((long)&datagrams->base + lVar3),__size);
      (conn->egress).datagram_frame_payloads.count = sVar2;
      *(void **)((long)&(conn->egress).datagram_frame_payloads.payloads[sVar1].base + lVar3) =
           __dest;
      *(size_t *)((long)&(conn->egress).datagram_frame_payloads.payloads[sVar1].len + lVar3) =
           __size;
      lVar3 = lVar3 + 0x10;
      num_datagrams = num_datagrams - 1;
    } while (num_datagrams != 0);
  }
  return;
}

Assistant:

void quicly_send_datagram_frames(quicly_conn_t *conn, ptls_iovec_t *datagrams, size_t num_datagrams)
{
    for (size_t i = 0; i != num_datagrams; ++i) {
        if (conn->egress.datagram_frame_payloads.count == PTLS_ELEMENTSOF(conn->egress.datagram_frame_payloads.payloads))
            break;
        void *copied;
        if ((copied = malloc(datagrams[i].len)) == NULL)
            break;
        memcpy(copied, datagrams[i].base, datagrams[i].len);
        conn->egress.datagram_frame_payloads.payloads[conn->egress.datagram_frame_payloads.count++] =
            ptls_iovec_init(copied, datagrams[i].len);
    }
}